

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalEncoder::EncodeTraversalSymbols
          (MeshEdgebreakerTraversalEncoder *this)

{
  EncoderBuffer *this_00;
  EdgebreakerTopologyBitPattern value;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  this_00 = &this->traversal_buffer_;
  iVar2 = (*this->encoder_impl_->_vptr_MeshEdgebreakerEncoderImplInterface[10])();
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x70);
  EncoderBuffer::StartBitEncoding
            (this_00,(ulong)(*(long *)(lVar1 + 200) - *(long *)(lVar1 + 0xc0)) >> 2 & 0xffffffff,
             true);
  uVar3 = (ulong)((long)(this->symbols_).
                        super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->symbols_).
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    value = (this->symbols_).
            super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
            ._M_impl.super__Vector_impl_data._M_start[(uint)uVar3 & 0x7fffffff];
    EncoderBuffer::EncodeLeastSignificantBits32
              (this_00,*(int *)(edge_breaker_topology_bit_pattern_length + (ulong)value * 4),value);
  }
  EncoderBuffer::EndBitEncoding(this_00);
  return;
}

Assistant:

void EncodeTraversalSymbols() {
    // Bit encode the collected symbols.
    // Allocate enough storage for the bit encoder.
    // It's guaranteed that each face will need only up to 3 bits.
    traversal_buffer_.StartBitEncoding(
        encoder_impl_->GetEncoder()->mesh()->num_faces() * 3, true);
    for (int i = static_cast<int>(symbols_.size() - 1); i >= 0; --i) {
      traversal_buffer_.EncodeLeastSignificantBits32(
          edge_breaker_topology_bit_pattern_length[symbols_[i]], symbols_[i]);
    }
    traversal_buffer_.EndBitEncoding();
  }